

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void printTo<>(FILE *fp,String *fmtstr)

{
  char *pcVar1;
  String local_38;
  String *local_18;
  String *fmtstr_local;
  FILE *fp_local;
  
  local_18 = fmtstr;
  fmtstr_local = (String *)fp;
  format(&local_38,fmtstr);
  pcVar1 = String::c_str(&local_38);
  fprintf((FILE *)fp,"%s",pcVar1);
  String::~String(&local_38);
  return;
}

Assistant:

void printTo (FILE* fp, const String& fmtstr, const argtypes&... args)
{
	fprintf (fp, "%s", format (fmtstr, args...).c_str());
}